

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

void getframe(void)

{
  undefined8 unaff_RBP;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined8 unaff_retaddr;
  
  *in_RSI = unaff_retaddr;
  *in_RDI = unaff_RBP;
  return;
}

Assistant:

static void __attribute__((naked,optimize("O0")))
getframe(void ***bp, void  ***ip) {
#ifndef __clang__
    (void)ip;
    (void)bp;
#endif
    asm( "mov (%rsp), %rax;"
         "mov %rax, (%rsi);"
         "mov %rbp, (%rdi);"
         "ret;"
    );
}